

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

void prvTidyUngetChar(uint c,StreamIn *in)

{
  ushort uVar1;
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var2;
  tchar *ptVar3;
  uint uVar4;
  
  if (c != 0xffffffff) {
    in->pushed = yes;
    if (in->bufsize <= in->bufpos + 1) {
      p_Var2 = in->allocator->vtbl->realloc;
      uVar4 = in->bufsize + 1;
      in->bufsize = uVar4;
      ptVar3 = (tchar *)(*p_Var2)(in->allocator,in->charbuf,(ulong)uVar4 << 2);
      in->charbuf = ptVar3;
    }
    uVar4 = in->bufpos;
    in->bufpos = uVar4 + 1;
    in->charbuf[uVar4] = c;
    if (c == 10) {
      in->curline = in->curline + -1;
    }
    uVar1 = in->curlastpos;
    if (in->firstlastpos == uVar1) {
      in->curcol = 0;
    }
    else {
      in->curcol = in->lastcols[uVar1];
      if ((ulong)uVar1 == 0) {
        in->curlastpos = 0x40;
      }
      in->curlastpos = in->curlastpos - 1;
    }
  }
  return;
}

Assistant:

void TY_(UngetChar)( uint c, StreamIn *in )
{
    if (c == EndOfStream)
    {
        /* fprintf(stderr, "Attempt to UngetChar EOF\n"); */
        return;
    }
    
    in->pushed = yes;

    if (in->bufpos + 1 >= in->bufsize)
        in->charbuf = (tchar*)TidyRealloc(in->allocator, in->charbuf, sizeof(tchar) * ++(in->bufsize));

    in->charbuf[(in->bufpos)++] = c;

    if (c == '\n')
        --(in->curline);

    RestoreLastPos( in );
}